

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::resize(Application *this,size_t w,size_t h)

{
  size_t in_RDX;
  Camera *in_RSI;
  long in_RDI;
  anon_class_1_0_00000001 set_params;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined1 depth;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  Application *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffe0;
  int iVar2;
  
  *(Camera **)(in_RDI + 0x220) = in_RSI;
  *(size_t *)(in_RDI + 0x228) = in_RDX;
  Camera::set_screen_size(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  OSDText::resize((OSDText *)(in_RDI + 0x370),(size_t)in_RSI,in_RDX);
  iVar2 = (int)in_RDX;
  set_projection_matrix(in_stack_ffffffffffffffd0);
  if (*(int *)(in_RDI + 0xc) != 0) {
    PathTracer::set_frame_size
              ((PathTracer *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  Timeline::resize((Timeline *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  depth = (undefined1)((uint)in_stack_ffffffffffffffbc >> 0x18);
  Timeline::move((Timeline *)(in_RDI + 0x400),0,iVar2 + -0x40);
  (*__glewBindFramebuffer)(0x8d40,*(GLuint *)(in_RDI + 0x474));
  glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x46c));
  uVar1 = 0x1401;
  glTexImage2D(0xde1,0,0x8058,*(undefined8 *)(in_RDI + 0x220),
               *(ulong *)(in_RDI + 0x228) & 0xffffffff,0,0x80e1,0x1401,0);
  resize::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(bool)depth);
  glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x470));
  uVar1 = 0x1401;
  glTexImage2D(0xde1,0,0x81a6,*(undefined8 *)(in_RDI + 0x220),
               *(ulong *)(in_RDI + 0x228) & 0xffffffff,0,0x1902,0x1401,0);
  resize::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(bool)depth);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,*(GLuint *)(in_RDI + 0x46c),0);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,*(GLuint *)(in_RDI + 0x470),0);
  (*__glewBindFramebuffer)(0x8d40,*(GLuint *)(in_RDI + 0x480));
  glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x478));
  uVar1 = 0x1401;
  glTexImage2D(0xde1,0,0x8058,*(undefined8 *)(in_RDI + 0x220),
               *(ulong *)(in_RDI + 0x228) & 0xffffffff,0,0x80e1,0x1401,0);
  resize::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(bool)depth);
  glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x47c));
  uVar1 = 0x1401;
  glTexImage2D(0xde1,0,0x81a6,*(undefined8 *)(in_RDI + 0x220),
               *(ulong *)(in_RDI + 0x228) & 0xffffffff,0,0x1902,0x1401,0);
  resize::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),(bool)depth);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,*(GLuint *)(in_RDI + 0x478),0);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,*(GLuint *)(in_RDI + 0x47c),0);
  (*__glewBindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Application::resize(size_t w, size_t h) {
  screenW = w;
  screenH = h;
  camera.set_screen_size(w, h);
  textManager.resize(w, h);
  set_projection_matrix();
  if (mode != MODEL_MODE) {
    pathtracer->set_frame_size(w, h);
  }
  timeline.resize(w, 64);
  timeline.move(0, h - 64);

  auto set_params = [](bool depth) {
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    if(depth) {
      glTexParameteri(GL_TEXTURE_2D, GL_DEPTH_TEXTURE_MODE, GL_INTENSITY);
      glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_R_TO_TEXTURE);
      glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL);
    }
  };

  // update backface fbo texture
  glBindFramebuffer(GL_FRAMEBUFFER, backface_fbo);
  glBindTexture(GL_TEXTURE_2D, backface_color_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_RGBA8, screenW, screenH, 0, GL_BGRA, GL_UNSIGNED_BYTE, NULL);
  set_params(false);
  glBindTexture(GL_TEXTURE_2D, backface_depth_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT24, screenW, screenH, 0, GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, NULL);
  set_params(true);

  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, backface_color_tex, 0
  );
  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, backface_depth_tex, 0
  );


  // update frontface fbo texture
  glBindFramebuffer(GL_FRAMEBUFFER, frntface_fbo);
  glBindTexture(GL_TEXTURE_2D, frntface_color_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_RGBA8, screenW, screenH, 0, GL_BGRA, GL_UNSIGNED_BYTE, NULL);
  set_params(false);
  glBindTexture(GL_TEXTURE_2D, frntface_depth_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT24, screenW, screenH, 0, GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, NULL);
  set_params(true);

  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, frntface_color_tex, 0
  );
  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, frntface_depth_tex, 0
  );
  glBindFramebuffer(GL_FRAMEBUFFER, 0);
}